

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_nav2Duu.cpp
# Opt level: O0

bool __thiscall EnvironmentNAV2DUU::IsValidRobotPosition(EnvironmentNAV2DUU *this,int X,int Y)

{
  bool local_11;
  int Y_local;
  int X_local;
  EnvironmentNAV2DUU *this_local;
  
  local_11 = false;
  if ((((-1 < X) && (local_11 = false, X < (this->EnvNAV2DUUCfg).EnvWidth_c)) &&
      (local_11 = false, -1 < Y)) &&
     ((local_11 = false, Y < (this->EnvNAV2DUUCfg).EnvHeight_c &&
      (local_11 = false, (this->EnvNAV2DUUCfg).Grid2D[X][Y] < (this->EnvNAV2DUUCfg).obsthresh)))) {
    local_11 = (this->EnvNAV2DUUCfg).UncertaintyGrid2D[X][Y] < 1e-05;
  }
  return local_11;
}

Assistant:

bool EnvironmentNAV2DUU::IsValidRobotPosition(int X, int Y)
{
    return (X >= 0 && X < EnvNAV2DUUCfg.EnvWidth_c && Y >= 0 && Y < EnvNAV2DUUCfg.EnvHeight_c &&
            EnvNAV2DUUCfg.Grid2D[X][Y] < EnvNAV2DUUCfg.obsthresh &&
            EnvNAV2DUUCfg.UncertaintyGrid2D[X][Y] < NAV2DUU_ERR_EPS);
}